

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O0

void __thiscall AST::ASTBuilder::insertRightChild(ASTBuilder *this)

{
  reference ppAVar1;
  ASTNode *local_20;
  value_type A;
  value_type B;
  ASTBuilder *this_local;
  
  B = (value_type)this;
  ppAVar1 = std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>
            ::top(&this->stack);
  A = *ppAVar1;
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::pop
            (&this->stack);
  ppAVar1 = std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>
            ::top(&this->stack);
  local_20 = *ppAVar1;
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::pop
            (&this->stack);
  ASTNode::addChildToRight(local_20,A);
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::push
            (&this->stack,&local_20);
  return;
}

Assistant:

void AST::ASTBuilder::insertRightChild() {
    auto B = stack.top();
    stack.pop();
    auto A = stack.top();
    stack.pop();
    A->addChildToRight(B);
    stack.push(A);
}